

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

void Gia_ManComputeDoms(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (p->vDoms == (Vec_Int_t *)0x0) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 0;
    pVVar4->nSize = 0;
    pVVar4->pArray = (int *)0x0;
    p->vDoms = pVVar4;
  }
  pVVar4 = p->vDoms;
  uVar6 = p->nObjs;
  if (pVVar4->nCap < (int)uVar6) {
    if (pVVar4->pArray == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar6 << 2);
    }
    else {
      piVar5 = (int *)realloc(pVVar4->pArray,(long)(int)uVar6 << 2);
    }
    pVVar4->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar4->nCap = uVar6;
  }
  if (0 < (int)uVar6) {
    memset(pVVar4->pArray,0xff,(ulong)uVar6 * 4);
  }
  pVVar4->nSize = uVar6;
  lVar8 = (long)p->nObjs;
  if (0 < lVar8) {
    lVar9 = lVar8 + 1;
    lVar8 = lVar8 * 0xc;
    do {
      lVar11 = lVar8 + -0xc;
      lVar10 = lVar9 + -1;
      if (p->nObjs < lVar10) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return;
      }
      if (lVar9 != 2) {
        uVar2 = *(ulong *)(&pGVar1[-1].field_0x0 + lVar8);
        uVar6 = (uint)uVar2;
        if ((((byte)(uVar2 >> 0x3e) & 1) == 0 && (~uVar6 & 0x9fffffff) != 0) &&
           (((p->pRefs == (int *)0x0 || ((~uVar6 & 0x1fffffff) == 0 || (int)uVar6 < 0)) ||
            (p->pRefs[lVar9 + -2] != 0)))) {
          iVar3 = (int)lVar9;
          if ((uVar2 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar6) {
            if (((int)uVar6 < 0) || (iVar7 = (int)(uVar2 & 0x1fffffff), iVar7 == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                            ,0x69,"void Gia_ManComputeDoms(Gia_Man_t *)");
            }
            Gia_ManAddDom(p,(Gia_Obj_t *)((long)pGVar1 + (ulong)(uint)(iVar7 << 2) * -3 + lVar11),
                          iVar3 + -2);
            uVar6 = *(uint *)(&pGVar1[-1].field_0x4 + lVar8);
          }
          else {
            if (p->nObjs < lVar10) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            if (p->vDoms->nSize < lVar10) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            p->vDoms->pArray[lVar9 + -2] = iVar3 + -2;
            uVar6 = (uint)*(undefined8 *)(&pGVar1[-1].field_0x0 + lVar8);
          }
          Gia_ManAddDom(p,(Gia_Obj_t *)
                          ((long)pGVar1 + lVar11 + (ulong)((uVar6 & 0x1fffffff) << 2) * -3),
                        iVar3 + -2);
        }
      }
      lVar9 = lVar10;
      lVar8 = lVar11;
    } while (1 < lVar10);
  }
  return;
}

Assistant:

void Gia_ManComputeDoms( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->vDoms == NULL )
        p->vDoms = Vec_IntAlloc( 0 );
    Vec_IntFill( p->vDoms, Gia_ManObjNum(p), -1 );
    Gia_ManForEachObjReverse( p, pObj, i )
    {
        if ( i == 0 || Gia_ObjIsCi(pObj) )
            continue;
        if ( pObj->fMark1 || (p->pRefs && Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p, pObj) == 0) )
            continue;
        if ( Gia_ObjIsCo(pObj) )
        {
            Gia_ObjSetDom( p, pObj, i );
            Gia_ManAddDom( p, Gia_ObjFanin0(pObj), i );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        Gia_ManAddDom( p, Gia_ObjFanin0(pObj), i );
        Gia_ManAddDom( p, Gia_ObjFanin1(pObj), i );
    }
}